

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O0

int do_EC_KEY_print(BIO *bp,EC_KEY *x,int off,int ktype)

{
  char *pcVar1;
  EC_KEY *pEVar2;
  int iVar3;
  point_conversion_form_t form;
  EC_POINT *pEVar4;
  size_t len;
  bool bVar5;
  char *local_78;
  int ret;
  size_t pub_len;
  uint8_t *pub;
  BIGNUM *priv_key;
  char *pcStack_38;
  int curve_name;
  char *ecstr;
  EC_GROUP *group;
  int ktype_local;
  int off_local;
  EC_KEY *x_local;
  BIO *bp_local;
  
  group._0_4_ = ktype;
  group._4_4_ = off;
  _ktype_local = x;
  x_local = (EC_KEY *)bp;
  if ((x == (EC_KEY *)0x0) ||
     (ecstr = (char *)EC_KEY_get0_group((EC_KEY *)x), (EC_GROUP *)ecstr == (EC_GROUP *)0x0)) {
    ERR_put_error(6,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/print.cc"
                  ,0xcf);
    bp_local._4_4_ = 0;
  }
  else {
    if ((int)group == 2) {
      pcStack_38 = "Private-Key";
    }
    else if ((int)group == 1) {
      pcStack_38 = "Public-Key";
    }
    else {
      pcStack_38 = "ECDSA-Parameters";
    }
    iVar3 = BIO_indent((BIO *)x_local,group._4_4_,0x80);
    if (iVar3 == 0) {
      bp_local._4_4_ = 0;
    }
    else {
      priv_key._4_4_ = EC_GROUP_get_curve_name((EC_GROUP *)ecstr);
      pEVar2 = x_local;
      pcVar1 = pcStack_38;
      if (priv_key._4_4_ == 0) {
        local_78 = "unknown curve";
      }
      else {
        local_78 = EC_curve_nid2nist(priv_key._4_4_);
      }
      iVar3 = BIO_printf((BIO *)pEVar2,"%s: (%s)\n",pcVar1,local_78);
      if (iVar3 < 1) {
        bp_local._4_4_ = 0;
      }
      else if ((((int)group == 2) &&
               (pub = (uint8_t *)EC_KEY_get0_private_key((EC_KEY *)_ktype_local),
               (BIGNUM *)pub != (BIGNUM *)0x0)) &&
              (iVar3 = bn_print((BIO *)x_local,"priv:",(BIGNUM *)pub,group._4_4_), iVar3 == 0)) {
        bp_local._4_4_ = 0;
      }
      else {
        if ((0 < (int)group) &&
           (pEVar4 = EC_KEY_get0_public_key((EC_KEY *)_ktype_local), pEVar2 = _ktype_local,
           pEVar4 != (EC_POINT *)0x0)) {
          pub_len = 0;
          form = EC_KEY_get_conv_form((EC_KEY *)_ktype_local);
          len = EC_KEY_key2buf(pEVar2,form,(uint8_t **)&pub_len,(BN_CTX *)0x0);
          if (len == 0) {
            return 0;
          }
          iVar3 = BIO_indent((BIO *)x_local,group._4_4_,0x80);
          bVar5 = false;
          if (iVar3 != 0) {
            iVar3 = BIO_puts((BIO *)x_local,"pub:");
            bVar5 = false;
            if (0 < iVar3) {
              iVar3 = print_hex((BIO *)x_local,(uint8_t *)pub_len,len,group._4_4_);
              bVar5 = iVar3 != 0;
            }
          }
          OPENSSL_free((void *)pub_len);
          if (!bVar5) {
            return 0;
          }
        }
        bp_local._4_4_ = 1;
      }
    }
  }
  return bp_local._4_4_;
}

Assistant:

static int do_EC_KEY_print(BIO *bp, const EC_KEY *x, int off, int ktype) {
  const EC_GROUP *group;
  if (x == NULL || (group = EC_KEY_get0_group(x)) == NULL) {
    OPENSSL_PUT_ERROR(EVP, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }

  const char *ecstr;
  if (ktype == 2) {
    ecstr = "Private-Key";
  } else if (ktype == 1) {
    ecstr = "Public-Key";
  } else {
    ecstr = "ECDSA-Parameters";
  }

  if (!BIO_indent(bp, off, 128)) {
    return 0;
  }
  int curve_name = EC_GROUP_get_curve_name(group);
  if (BIO_printf(bp, "%s: (%s)\n", ecstr,
                 curve_name == NID_undef
                     ? "unknown curve"
                     : EC_curve_nid2nist(curve_name)) <= 0) {
    return 0;
  }

  if (ktype == 2) {
    const BIGNUM *priv_key = EC_KEY_get0_private_key(x);
    if (priv_key != NULL &&  //
        !bn_print(bp, "priv:", priv_key, off)) {
      return 0;
    }
  }

  if (ktype > 0 && EC_KEY_get0_public_key(x) != NULL) {
    uint8_t *pub = NULL;
    size_t pub_len = EC_KEY_key2buf(x, EC_KEY_get_conv_form(x), &pub, NULL);
    if (pub_len == 0) {
      return 0;
    }
    int ret = BIO_indent(bp, off, 128) &&  //
              BIO_puts(bp, "pub:") > 0 &&  //
              print_hex(bp, pub, pub_len, off);
    OPENSSL_free(pub);
    if (!ret) {
      return 0;
    }
  }

  return 1;
}